

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_test.cpp
# Opt level: O0

void __thiscall
OperatorLeftShiftPrint_Basics_Test::OperatorLeftShiftPrint_Basics_Test
          (OperatorLeftShiftPrint_Basics_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__OperatorLeftShiftPrint_Basics_Test_03744758;
  return;
}

Assistant:

TEST(OperatorLeftShiftPrint, Basics) {
    {
        std::ostringstream os;
        os << Point2f(105.5, -12.75);
        EXPECT_EQ("[ 105.5, -12.75 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Point2i(-9, 5);
        EXPECT_EQ("[ -9, 5 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Point3f(0., 1.25, -9.25);
        EXPECT_EQ("[ 0, 1.25, -9.25 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Point3i(7, -10, 4);
        EXPECT_EQ("[ 7, -10, 4 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Vector2f(105.5, -12.75);
        EXPECT_EQ("[ 105.5, -12.75 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Vector2i(-9, 5);
        EXPECT_EQ("[ -9, 5 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Vector3f(0., 1.25, -9.25);
        EXPECT_EQ("[ 0, 1.25, -9.25 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Vector3i(7, -10, 4);
        EXPECT_EQ("[ 7, -10, 4 ]", os.str());
    }
    {
        std::ostringstream os;
        os << Normal3f(0., 1.25, -9.25);
        EXPECT_EQ("[ 0, 1.25, -9.25 ]", os.str());
    }
    {
        std::ostringstream os;
        Quaternion q;
        q.v = Vector3f(1.25, -8.25, 14.75);
        q.w = -0.5;
        os << q;
        EXPECT_EQ("[ 1.25, -8.25, 14.75, -0.5 ]", os.str());
    }
    {
        std::ostringstream os;
        Ray r(Point3f(-5.5, 2.75, 0.), Vector3f(1.0, -8.75, 2.25), 0.25);
        os << r;
        EXPECT_EQ("[ o: [ -5.5, 2.75, 0 ] d: [ 1, -8.75, 2.25 ] time: 0.25, "
                  "medium: (nullptr) ]",
                  os.str());
    }
    {
        std::ostringstream os;
        Bounds2f b(Point2f(2, -5), Point2f(-8, 3));
        os << b;
        EXPECT_EQ("[ [ -8, -5 ] - [ 2, 3 ] ]", os.str());
    }
    {
        std::ostringstream os;
        Bounds3f b(Point3f(2, -5, .125), Point3f(-8, 3, -128.5));
        os << b;
        EXPECT_EQ("[ [ -8, -5, -128.5 ] - [ 2, 3, 0.125 ] ]", os.str());
    }
    {
        std::ostringstream os;
        SquareMatrix<4> m(0., -1., 2., -3.5, 4.5, 5.5, -6.5, -7.5, 8., 9.25, 10.75, -11,
                          12, 13.25, 14.5, -15.875);
        os << m;
        EXPECT_EQ("[ [ 0, -1, 2, -3.5 ], "
                  "[ 4.5, 5.5, -6.5, -7.5 ], "
                  "[ 8, 9.25, 10.75, -11 ], "
                  "[ 12, 13.25, 14.5, -15.875 ] "
                  "]",
                  os.str());
    }
    {
        std::ostringstream os;
        Transform t = Translate(Vector3f(-1.25, 3.5, 7.875)) * Scale(2., -8., 1);
        os << t;
        EXPECT_EQ("[ m: [ [ 2, 0, 0, -1.25 ], [ 0, -8, 0, 3.5 ], [ 0, 0, 1, "
                  "7.875 ], [ 0, 0, 0, 1 ] ] "
                  "mInv: [ [ 0.5, 0, 0, 0.625 ], [ 0, -0.125, 0, 0.4375 ], [ "
                  "0, 0, 1, -7.875 ], [ 0, 0, 0, 1 ] ] ]",
                  os.str());
    }
}